

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Parser * __thiscall
Catch::clara::detail::ComposableParserImpl<Catch::clara::detail::ExeName>::operator|
          (ComposableParserImpl<Catch::clara::detail::ExeName> *this,Help *other)

{
  Parser *in_RSI;
  Parser *in_RDI;
  ExeName *in_stack_ffffffffffffff90;
  Parser *in_stack_ffffffffffffff98;
  
  Parser::Parser(in_RSI);
  Parser::operator|(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Parser::operator|(in_stack_ffffffffffffff98,(Help *)in_stack_ffffffffffffff90);
  Parser::~Parser(in_RDI);
  Parser::~Parser(in_RDI);
  return in_RDI;
}

Assistant:

auto ComposableParserImpl<DerivedT>::operator|( T const &other ) const -> Parser {
        return Parser() | static_cast<DerivedT const &>( *this ) | other;
    }